

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoBinop<unsigned_long,unsigned_long>
          (Thread *this,BinopTrapFunc<unsigned_long,_unsigned_long> *f,Ptr *out_trap)

{
  RunResult RVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  Ptr local_78;
  undefined1 local_60 [8];
  string msg;
  unsigned_long out;
  unsigned_long lhs;
  unsigned_long rhs;
  Ptr *out_trap_local;
  BinopTrapFunc<unsigned_long,_unsigned_long> *f_local;
  Thread *this_local;
  
  uVar2 = Pop<unsigned_long>(this);
  uVar3 = Pop<unsigned_long>(this);
  std::__cxx11::string::string((string *)local_60);
  RVar1 = (*f)(uVar3,uVar2,(unsigned_long *)(msg.field_2._M_local_buf + 8),(string *)local_60);
  if (RVar1 == Trap) {
    Trap::New(&local_78,this->store_,(string *)local_60,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=(out_trap,&local_78);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_78);
  }
  else {
    Push<unsigned_long>(this,msg.field_2._8_8_);
    this_local._4_4_ = Ok;
  }
  std::__cxx11::string::~string((string *)local_60);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoBinop(BinopTrapFunc<R, T> f, Trap::Ptr* out_trap) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  T out;
  std::string msg;
  TRAP_IF(f(lhs, rhs, &out, &msg) == RunResult::Trap, msg);
  Push<R>(out);
  return RunResult::Ok;
}